

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O3

void __thiscall
chrono::ChTimestepperTrapezoidal::ChTimestepperTrapezoidal
          (ChTimestepperTrapezoidal *this,ChIntegrableIIorder *intgr)

{
  ChTimestepperIIorder::ChTimestepperIIorder(&this->super_ChTimestepperIIorder,intgr);
  (this->super_ChImplicitIterativeTimestepper).maxiters = 6;
  (this->super_ChImplicitIterativeTimestepper).reltol = 0.0001;
  (this->super_ChImplicitIterativeTimestepper).abstolS = 1e-10;
  (this->super_ChImplicitIterativeTimestepper).abstolL = 1e-10;
  (this->super_ChImplicitIterativeTimestepper).numiters = 0;
  (this->super_ChImplicitIterativeTimestepper).numsetups = 0;
  (this->super_ChImplicitIterativeTimestepper).numsolves = 0;
  (this->super_ChTimestepperIIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperTrapezoidal_00b436c8;
  (this->super_ChImplicitIterativeTimestepper)._vptr_ChImplicitIterativeTimestepper =
       (_func_int **)&PTR__ChTimestepperTrapezoidal_00b43748;
  ChStateDelta::ChStateDelta(&this->Dv,(ChIntegrable *)0x0);
  (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ChState::ChState(&this->Xnew,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Vnew,(ChIntegrable *)0x0);
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  return;
}

Assistant:

virtual Type GetType() const override { return Type::TRAPEZOIDAL; }